

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip_encryption_header.c
# Opt level: O0

void test_read_format_zip_encryption_header(void)

{
  archive *a_00;
  char buff [128];
  archive *a;
  archive_entry *ae;
  char *refname;
  char *in_stack_00000370;
  archive *in_stack_ffffffffffffff58;
  archive *paVar1;
  archive_entry *entry;
  archive_entry **entry_00;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar2;
  uint in_stack_ffffffffffffff64;
  wchar_t in_stack_ffffffffffffff68;
  wchar_t in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  wchar_t in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  wchar_t in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  archive *in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  wchar_t in_stack_ffffffffffffffa8;
  undefined8 local_10;
  
  extract_reference_file(in_stack_00000370);
  a_00 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                   (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58);
  archive_read_support_filter_all(in_stack_ffffffffffffff58);
  paVar1 = a_00;
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (longlong)a_00,(char *)0x1bb5c8,in_stack_ffffffffffffff90);
  archive_read_support_format_all(paVar1);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (longlong)a_00,(char *)0x1bb607,in_stack_ffffffffffffff90);
  archive_read_open_filename
            ((archive *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (longlong)a_00,(char *)0x1bb653,in_stack_ffffffffffffff90);
  archive_read_has_encrypted_entries
            ((archive *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  paVar1 = a_00;
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (longlong)a_00,(char *)0x1bb695,in_stack_ffffffffffffff90);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (archive_entry **)paVar1);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (longlong)a_00,(char *)0x1bb6df,in_stack_ffffffffffffff90);
  archive_entry_mode(local_10);
  entry = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),0,
                      (char *)0x1bb71c,in_stack_ffffffffffffff90);
  archive_entry_pathname(entry);
  uVar2 = 0;
  assertion_equal_string
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
             (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (char *)((ulong)in_stack_ffffffffffffff64 << 0x20),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8);
  archive_entry_mtime(local_10);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar2),0,(char *)0x1bb79c,
                      in_stack_ffffffffffffff90);
  archive_entry_size(local_10);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar2),0,(char *)0x1bb7d7,
                      in_stack_ffffffffffffff90);
  archive_entry_is_data_encrypted(local_10);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar2),0,(char *)0x1bb815,
                      in_stack_ffffffffffffff90);
  archive_entry_is_metadata_encrypted(local_10);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar2),0,(char *)0x1bb853,
                      in_stack_ffffffffffffff90);
  archive_read_has_encrypted_entries
            ((archive *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar2),(longlong)a_00,
                      (char *)0x1bb893,in_stack_ffffffffffffff90);
  archive_read_data(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                    (size_t)in_stack_ffffffffffffff88);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar2),0,(char *)0x1bb8dd,
                      in_stack_ffffffffffffff90);
  archive_file_count(a_00);
  entry_00 = (archive_entry **)0x0;
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar2),0,(char *)0x1bb91b,
                      in_stack_ffffffffffffff90);
  archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffff64,uVar2),entry_00);
  paVar1 = a_00;
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar2),(longlong)a_00,
                      (char *)0x1bb965,in_stack_ffffffffffffff90);
  archive_filter_code((archive *)CONCAT44(in_stack_ffffffffffffff64,uVar2),
                      (int)((ulong)paVar1 >> 0x20));
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar2),(longlong)a_00,
                      (char *)0x1bb9a6,in_stack_ffffffffffffff90);
  archive_format(a_00);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar2),(longlong)a_00,
                      (char *)0x1bb9e6,in_stack_ffffffffffffff90);
  archive_read_close((archive *)0x1bb9f3);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar2),0,(char *)0x1bba21,
                      in_stack_ffffffffffffff90);
  archive_read_free((archive *)0x1bba2e);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar2),0,(char *)0x1bba5c,
                      in_stack_ffffffffffffff90);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_encryption_header)
{
	/* This file is password protected (encrypted) with AES-256. The headers
	   ARE encrypted. Password is "12345678". */
	const char *refname = "test_read_format_zip_encryption_header.zip";
	struct archive_entry *ae;
	struct archive *a;
	char buff[128];

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	assertEqualIntA(a, ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW, archive_read_has_encrypted_entries(a));

	/* Verify regular file but with encrypted headers
	   as a consequence, all meta information is invalid. */
	assertEqualIntA(a, ARCHIVE_FATAL, archive_read_next_header(a, &ae));
	
	assertEqualInt(0, archive_entry_mode(ae));
	assertEqualString(NULL, archive_entry_pathname(ae));
	assertEqualInt(0, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualInt(1, archive_entry_is_data_encrypted(ae));
	assertEqualInt(1, archive_entry_is_metadata_encrypted(ae));
	assertEqualIntA(a, 1, archive_read_has_encrypted_entries(a));
	assertEqualInt(ARCHIVE_FATAL, archive_read_data(a, buff, sizeof(buff)));

	assertEqualInt(1, archive_file_count(a));

	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_FATAL, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_ZIP, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}